

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::compute_hash_render_pass2
               (VkRenderPassCreateInfo2 *create_info,Hash *out_hash)

{
  VkAttachmentDescription2 *pVVar1;
  VkSubpassDependency2 *pVVar2;
  VkSubpassDescription2 *pVVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Hasher local_48;
  ulong local_40;
  ulong *local_38;
  
  local_48.h = ((((((ulong)create_info->flags ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
                  (ulong)create_info->attachmentCount) * 0x100000001b3 ^
                 (ulong)create_info->dependencyCount) * 0x100000001b3 ^
                (ulong)create_info->subpassCount) * 0x100000001b3 ^
               (ulong)create_info->correlatedViewMaskCount) * 0x100000001b3 ^ 2;
  local_38 = out_hash;
  if (create_info->attachmentCount != 0) {
    lVar7 = 0x30;
    uVar5 = 0;
    do {
      pVVar1 = create_info->pAttachments;
      local_48.h = ((((((((local_48.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)pVVar1 + lVar7 + -0x20)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)pVVar1 + lVar7 + -4)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar1->sType + lVar7)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)pVVar1 + lVar7 + -0x1c)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)pVVar1 + lVar7 + -0x14)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)pVVar1 + lVar7 + -0x10)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)pVVar1 + lVar7 + -0xc)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)pVVar1 + lVar7 + -8)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)pVVar1 + lVar7 + -0x18);
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,
                               *(void **)((long)pVVar1 + lVar7 + -0x28),(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x38;
    } while (uVar5 < create_info->attachmentCount);
  }
  if (create_info->dependencyCount != 0) {
    lVar7 = 0x2c;
    uVar5 = 0;
    do {
      pVVar2 = create_info->pDependencies;
      local_48.h = (((((((local_48.h * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -4))
                         * 0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -8)) *
                        0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -0xc)) *
                       0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -0x1c)) *
                      0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -0x18)) *
                     0x100000001b3 ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -0x14)) * 0x100000001b3
                   ^ (ulong)*(uint *)((long)pVVar2 + lVar7 + -0x10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->sType + lVar7);
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,
                               *(void **)((long)pVVar2 + lVar7 + -0x24),(DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x30;
    } while (uVar5 < create_info->dependencyCount);
  }
  if (create_info->subpassCount != 0) {
    uVar5 = 0;
    do {
      pVVar3 = create_info->pSubpasses;
      uVar6 = (ulong)pVVar3[uVar5].preserveAttachmentCount;
      local_48.h = ((((local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar5].flags) * 0x100000001b3 ^
                     (ulong)pVVar3[uVar5].colorAttachmentCount) * 0x100000001b3 ^
                    (ulong)pVVar3[uVar5].inputAttachmentCount) * 0x100000001b3 ^ uVar6) *
                   0x100000001b3 ^ (ulong)pVVar3[uVar5].pipelineBindPoint;
      if (uVar6 != 0) {
        uVar8 = 0;
        do {
          local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar5].pPreserveAttachments[uVar8]
          ;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      local_40 = uVar5;
      if (pVVar3[uVar5].colorAttachmentCount != 0) {
        bVar4 = hash_reference_base(&local_48,pVVar3[uVar5].pColorAttachments);
        if (!bVar4) {
          return false;
        }
        uVar6 = 0;
        lVar7 = 0x20;
        while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar5].colorAttachmentCount) {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar5].pColorAttachments)->sType + lVar7));
          lVar7 = lVar7 + 0x20;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pVVar3[uVar5].inputAttachmentCount != 0) {
        bVar4 = hash_reference_base(&local_48,pVVar3[uVar5].pInputAttachments);
        if (!bVar4) {
          return false;
        }
        uVar6 = 0;
        lVar7 = 0x20;
        while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar5].inputAttachmentCount) {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar5].pInputAttachments)->sType + lVar7));
          lVar7 = lVar7 + 0x20;
          if (!bVar4) {
            return false;
          }
        }
      }
      if ((pVVar3[uVar5].pResolveAttachments != (VkAttachmentReference2 *)0x0) &&
         (pVVar3[uVar5].colorAttachmentCount != 0)) {
        bVar4 = hash_reference_base(&local_48,pVVar3[uVar5].pResolveAttachments);
        if (!bVar4) {
          return false;
        }
        uVar6 = 0;
        lVar7 = 0x20;
        while (uVar6 = uVar6 + 1, uVar6 < pVVar3[uVar5].colorAttachmentCount) {
          bVar4 = hash_reference_base(&local_48,
                                      (VkAttachmentReference2 *)
                                      ((long)&(pVVar3[uVar5].pResolveAttachments)->sType + lVar7));
          lVar7 = lVar7 + 0x20;
          if (!bVar4) {
            return false;
          }
        }
      }
      if (pVVar3[uVar5].pDepthStencilAttachment == (VkAttachmentReference2 *)0x0) {
        local_48.h = local_48.h * 0x100000001b3;
      }
      else {
        bVar4 = hash_reference_base(&local_48,pVVar3[uVar5].pDepthStencilAttachment);
        if (!bVar4) {
          return false;
        }
      }
      local_48.h = local_48.h * 0x100000001b3 ^ (ulong)pVVar3[uVar5].viewMask;
      bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,pVVar3[uVar5].pNext,
                               (DynamicStateInfo *)0x0,0);
      if (!bVar4) {
        return false;
      }
      uVar5 = local_40 + 1;
    } while (uVar5 < create_info->subpassCount);
  }
  if ((ulong)create_info->correlatedViewMaskCount != 0) {
    uVar5 = 0;
    do {
      local_48.h = local_48.h * 0x100000001b3 ^ (ulong)create_info->pCorrelatedViewMasks[uVar5];
      uVar5 = uVar5 + 1;
    } while (create_info->correlatedViewMaskCount != uVar5);
  }
  bVar4 = hash_pnext_chain((StateRecorder *)0x0,&local_48,create_info->pNext,(DynamicStateInfo *)0x0
                           ,0);
  if (bVar4) {
    *local_38 = local_48.h;
  }
  return bVar4;
}

Assistant:

bool compute_hash_render_pass2(const VkRenderPassCreateInfo2 &create_info, Hash *out_hash)
{
	Hasher h;

	h.u32(create_info.flags);
	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);
	h.u32(create_info.correlatedViewMaskCount);
	h.u32(2);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		if (!hash_attachment2(h, att))
			return false;
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		if (!hash_dependency2(h, dep))
			return false;
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		if (!hash_subpass2(h, subpass))
			return false;
	}

	for (uint32_t i = 0; i < create_info.correlatedViewMaskCount; i++)
		h.u32(create_info.pCorrelatedViewMasks[i]);

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}